

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::TextureCubeView::gather
          (TextureCubeView *this,Sampler *sampler,float s,float t,float r,int componentNdx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  int in_ECX;
  Vec4 (*dst) [4];
  undefined4 in_register_00000014;
  uint *puVar4;
  bool *pbVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  uint uVar10;
  undefined1 extraout_var [12];
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  Vec4 VVar19;
  CubeFaceFloatCoords CVar20;
  Vec4 sampleColors [4];
  ConstPixelBufferAccess faceAccesses [6];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  ConstPixelBufferAccess local_118 [6];
  
  puVar4 = (uint *)CONCAT44(in_register_00000014,componentNdx);
  lVar3 = 8;
  do {
    *(undefined8 *)((long)local_118[0].m_size.m_data + lVar3 + -0x10) = 0x2600000015;
    *(undefined8 *)((long)local_118[0].m_size.m_data + lVar3 + -8) = 0;
    *(undefined8 *)((long)local_118[0].m_size.m_data + lVar3) = 0;
    *(undefined8 *)((long)local_118[0].m_size.m_data + lVar3 + 8) = 0;
    *(undefined8 *)((long)local_118[0].m_pitch.m_data + lVar3 + 4) = 0;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0xf8);
  pbVar5 = (bool *)&sampler->wrapR;
  lVar3 = 0;
  do {
    dst = *(Vec4 (**) [4])pbVar5;
    *(void **)((long)(&local_118[0].m_pitch + 1) + lVar3 * 8) = *(void **)(*dst)[2].m_data;
    auVar12._0_8_ = *(undefined8 *)(*dst)[0].m_data;
    uVar1 = *(undefined8 *)((*dst)[0].m_data + 2);
    uVar2 = *(undefined8 *)((*dst)[1].m_data + 2);
    *(undefined8 *)(local_118[0].m_pitch.m_data + lVar3 * 2 + -1) = *(undefined8 *)(*dst)[1].m_data;
    *(undefined8 *)(local_118[0].m_pitch.m_data + lVar3 * 2 + 1) = uVar2;
    *(undefined8 *)(local_118[0].m_size.m_data + lVar3 * 2 + -2) = auVar12._0_8_;
    *(undefined8 *)(local_118[0].m_size.m_data + lVar3 * 2) = uVar1;
    lVar3 = lVar3 + 5;
    pbVar5 = pbVar5 + 8;
  } while (lVar3 != 0x1e);
  local_158._4_4_ = t;
  local_158._0_4_ = s;
  local_158._8_4_ = r;
  CVar20 = getCubeFaceCoords((Vec3 *)local_158);
  fVar16 = CVar20.t;
  uVar9 = extraout_var._0_4_;
  auVar12._0_8_ = CONCAT44(uVar9,fVar16);
  uVar10 = extraout_var._4_4_;
  auVar12._8_4_ = uVar10;
  uVar11 = extraout_var._8_4_;
  auVar12._12_4_ = uVar11;
  fVar18 = CVar20.s;
  if ((char)puVar4[6] != '\0') {
    uVar6 = *puVar4;
    fVar7 = 0.0;
    if (uVar6 < 7) {
      dst = (Vec4 (*) [4])0x57;
      if ((0x57U >> (uVar6 & 0x1f) & 1) == 0) {
        if (uVar6 == 3) {
          fVar7 = floorf(fVar18);
          fVar7 = (fVar18 - fVar7) * (float)local_118[0].m_size.m_data[0];
        }
        else {
          fVar8 = fVar18 * 0.5;
          fVar7 = floorf(fVar8);
          if ((fVar8 - fVar7 != 0.5) || (NAN(fVar8 - fVar7))) {
            fVar7 = floorf(fVar8 + 0.5);
          }
          else {
            fVar7 = 0.0;
            if (((long)(fVar8 + -0.5) & 1U) != 0) {
              fVar7 = 1.0;
            }
            fVar7 = fVar8 + -0.5 + fVar7;
          }
          fVar18 = fVar18 - (fVar7 + fVar7);
          uVar6 = -(uint)(-fVar18 <= fVar18);
          fVar7 = (float)(~uVar6 & (uint)-fVar18 | (uint)fVar18 & uVar6) *
                  (float)local_118[0].m_size.m_data[0];
        }
      }
      else {
        fVar7 = (float)local_118[0].m_size.m_data[0] * fVar18;
      }
    }
    uVar6 = puVar4[1];
    auVar13._4_12_ = auVar12._4_12_;
    fVar18 = fVar7;
    if (uVar6 < 7) {
      dst = (Vec4 (*) [4])0x57;
      if ((0x57U >> (uVar6 & 0x1f) & 1) == 0) {
        if (uVar6 == 3) {
          fVar7 = floorf(fVar16);
          auVar14._0_4_ = fVar16 - fVar7;
          auVar14._4_12_ = auVar13._4_12_;
        }
        else {
          fVar7 = fVar16 * 0.5;
          fVar8 = floorf(fVar7);
          if ((fVar7 - fVar8 != 0.5) || (NAN(fVar7 - fVar8))) {
            fVar8 = floorf(fVar7 + 0.5);
          }
          else {
            fVar8 = 0.0;
            if (((long)(fVar7 + -0.5) & 1U) != 0) {
              fVar8 = 1.0;
            }
            fVar8 = fVar7 + -0.5 + fVar8;
          }
          fVar16 = fVar16 - (fVar8 + fVar8);
          uVar6 = -(uint)(-fVar16 <= fVar16);
          auVar17._0_4_ = (uint)fVar16 & uVar6;
          auVar17._4_4_ = uVar9 & (uVar9 ^ 0x80000000);
          auVar17._8_4_ = uVar10 & (uVar10 ^ 0x80000000);
          auVar17._12_4_ = uVar11 & (uVar11 ^ 0x80000000);
          auVar14 = ZEXT416(~uVar6 & (uint)-fVar16) | auVar17;
        }
        auVar15._4_12_ = auVar14._4_12_;
        auVar15._0_4_ = auVar14._0_4_ * (float)local_118[0].m_size.m_data[0];
        auVar12._0_8_ = auVar15._0_8_;
      }
      else {
        auVar13._0_4_ = fVar16 * (float)local_118[0].m_size.m_data[0];
        auVar12._0_8_ = auVar13._0_8_;
      }
    }
    else {
      auVar12._0_8_ = 0;
    }
  }
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158._0_4_ = 0.0;
  local_158._4_4_ = 0.0;
  local_158._8_8_ = 0;
  getCubeLinearSamples(&local_118,CVar20.face,fVar18,(float)auVar12._0_8_,(int)local_158,dst);
  *(undefined8 *)this = 0;
  this->m_levels[0] = (ConstPixelBufferAccess *)0x0;
  lVar3 = 0;
  do {
    VVar19.m_data[1] = 0.0;
    VVar19.m_data[0] =
         (float)*(uint *)(local_158 +
                         (long)*(int *)((long)&DAT_01cc9fa0 + lVar3) * 0x10 + (long)in_ECX * 4);
    *(uint *)((long)this->m_levels + lVar3 + -8) =
         *(uint *)(local_158 + (long)*(int *)((long)&DAT_01cc9fa0 + lVar3) * 0x10 + (long)in_ECX * 4
                  );
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  VVar19.m_data[2] = (float)(int)auVar12._0_8_;
  VVar19.m_data[3] = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
  return (Vec4)VVar19.m_data;
}

Assistant:

Vec4 TextureCubeView::gather (const Sampler& sampler, float s, float t, float r, int componentNdx) const
{
	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
	for (int i = 0; i < (int)CUBEFACE_LAST; i++)
		faceAccesses[i] = m_levels[i][0];

	const CubeFaceFloatCoords	coords	= getCubeFaceCoords(Vec3(s, t, r));
	const int					size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float						u		= coords.s;
	float						v		= coords.t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, coords.s, size);
		v = unnormalize(sampler.wrapT, coords.t, size);
	}

	Vec4 sampleColors[4];
	getCubeLinearSamples(faceAccesses, coords.face, u, v, 0, sampleColors);

	const int	sampleIndices[4] = { 2, 3, 1, 0 }; // \note Gather returns the samples in a non-obvious order.
	Vec4		result;
	for (int i = 0; i < 4; i++)
		result[i] = sampleColors[sampleIndices[i]][componentNdx];

	return result;
}